

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

NetlistVariableAlias * __thiscall
netlist::Netlist::addVariableAlias(Netlist *this,Symbol *symbol,ConstantRange overlap)

{
  NetlistVariableAlias *pNVar1;
  NetlistVariableAlias *local_30;
  _Head_base<0UL,_netlist::NetlistNode_*,_false> local_28;
  ConstantRange local_20;
  
  local_20 = overlap;
  std::make_unique<netlist::NetlistVariableAlias,slang::ast::Symbol_const&,slang::ConstantRange&>
            ((Symbol *)&local_30,(ConstantRange *)symbol);
  pNVar1 = local_30;
  slang::ast::Symbol::appendHierarchicalPath(symbol,&local_30->hierarchicalPath);
  local_28._M_head_impl = &local_30->super_NetlistNode;
  local_30 = (NetlistVariableAlias *)0x0;
  std::
  vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
  ::emplace_back<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>
            ((vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
              *)&(this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes,
             (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
             &local_28);
  if ((NetlistVariableAlias *)local_28._M_head_impl != (NetlistVariableAlias *)0x0) {
    (*(((NetlistNode *)
       &(local_28._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
      super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node[1])();
  }
  if (local_30 != (NetlistVariableAlias *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return pNVar1;
}

Assistant:

NetlistVariableAlias& addVariableAlias(const ast::Symbol& symbol, ConstantRange overlap) {
        auto nodePtr = std::make_unique<NetlistVariableAlias>(symbol, overlap);
        auto& node = nodePtr->as<NetlistVariableAlias>();
        symbol.appendHierarchicalPath(node.hierarchicalPath);
        nodes.push_back(std::move(nodePtr));
        DEBUG_PRINT("New node: variable alias {}\n", node.hierarchicalPath);
        return node;
    }